

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Configtable_init(void)

{
  s_x4node *psVar1;
  int local_c;
  int i;
  
  if ((x4a == (s_x4 *)0x0) && (x4a = (s_x4 *)malloc(0x18), x4a != (s_x4 *)0x0)) {
    x4a->size = 0x40;
    x4a->count = 0;
    psVar1 = (s_x4node *)calloc(0x40,0x20);
    x4a->tbl = psVar1;
    if (x4a->tbl == (s_x4node *)0x0) {
      free(x4a);
      x4a = (s_x4 *)0x0;
    }
    else {
      x4a->ht = (s_x4node **)(x4a->tbl + 0x40);
      for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
        x4a->ht[local_c] = (s_x4node *)0x0;
      }
    }
  }
  return;
}

Assistant:

void Configtable_init(){
  if( x4a ) return;
  x4a = (struct s_x4*)malloc( sizeof(struct s_x4) );
  if( x4a ){
    x4a->size = 64;
    x4a->count = 0;
    x4a->tbl = (x4node*)calloc(64, sizeof(x4node) + sizeof(x4node*));
    if( x4a->tbl==0 ){
      free(x4a);
      x4a = 0;
    }else{
      int i;
      x4a->ht = (x4node**)&(x4a->tbl[64]);
      for(i=0; i<64; i++) x4a->ht[i] = 0;
    }
  }
}